

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

char * KINGetReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  pcVar1 = (char *)malloc(0x18);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1,"KIN_SUCCESS",0xc);
    break;
  case 1:
    builtin_strncpy(pcVar1,"KIN_INITIAL_GUESS_OK",0x15);
    break;
  case 2:
    builtin_strncpy(pcVar1,"KIN_STEP_LT_STPTOL",0x13);
    break;
  default:
    if (flag == 99) {
      builtin_strncpy(pcVar1,"KIN_WARNING",0xc);
    }
    else {
      builtin_strncpy(pcVar1,"NONE",5);
    }
    break;
  case -0xc:
    uVar3._0_1_ = 'L';
    uVar3._1_1_ = 'S';
    uVar3._2_1_ = 'O';
    uVar3._3_1_ = 'L';
    uVar4._0_1_ = 'V';
    uVar4._1_1_ = 'E';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'F';
    goto LAB_0010dc8d;
  case -0xb:
    uVar3._0_1_ = 'L';
    uVar3._1_1_ = 'S';
    uVar3._2_1_ = 'E';
    uVar3._3_1_ = 'T';
    uVar4._0_1_ = 'U';
    uVar4._1_1_ = 'P';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'F';
LAB_0010dc8d:
    pcVar1[0] = 'K';
    pcVar1[1] = 'I';
    pcVar1[2] = 'N';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar3;
    *(undefined4 *)(pcVar1 + 8) = uVar4;
    pcVar1[0xc] = 'A';
    pcVar1[0xd] = 'I';
    pcVar1[0xe] = 'L';
    pcVar1[0xf] = '\0';
    break;
  case -10:
    builtin_strncpy(pcVar1 + 7,"IT_FAIL",8);
    uVar2 = 0x494e494c5f4e494b;
    goto LAB_0010dd0b;
  case -9:
    builtin_strncpy(pcVar1,"KIN_LINSOLV_NO_RECOVERY",0x18);
    break;
  case -8:
    builtin_strncpy(pcVar1,"KIN_LINESEARCH_BCFAIL",0x16);
    break;
  case -7:
    builtin_strncpy(pcVar1,"KIN_MXNEWT_5X_EX",0x10);
    uVar2 = 0x44454445454358;
    goto LAB_0010dca6;
  case -6:
    builtin_strncpy(pcVar1,"KIN_MAXITER_REACHED",0x14);
    break;
  case -5:
    builtin_strncpy(pcVar1,"KIN_LINESEARCH_N",0x10);
    uVar2 = 0x564e4f434e4f4e;
LAB_0010dca6:
    *(undefined8 *)(pcVar1 + 0xf) = uVar2;
    break;
  case -4:
    uVar2 = 0x4c4941465f4d45;
    goto LAB_0010dcfd;
  case -3:
    builtin_strncpy(pcVar1 + 6,"_MALLOC",8);
    uVar2 = 0x4d5f4f4e5f4e494b;
    goto LAB_0010dd0b;
  case -2:
    builtin_strncpy(pcVar1 + 6,"L_INPUT",8);
    uVar2 = 0x5f4c4c495f4e494b;
    goto LAB_0010dd0b;
  case -1:
    uVar2 = 0x4c4c554e5f4d45;
LAB_0010dcfd:
    *(undefined8 *)(pcVar1 + 5) = uVar2;
    uVar2 = 0x5f4d454d5f4e494b;
LAB_0010dd0b:
    *(undefined8 *)pcVar1 = uVar2;
  }
  return pcVar1;
}

Assistant:

char *KINGetReturnFlagName(long int flag)
{
  char *name;

  name = (char *)malloc(24*sizeof(char));

  switch(flag) {
  case KIN_SUCCESS:
    sprintf(name, "KIN_SUCCESS");
    break;
  case KIN_INITIAL_GUESS_OK:
    sprintf(name, "KIN_INITIAL_GUESS_OK");
    break;
  case KIN_STEP_LT_STPTOL:
    sprintf(name, "KIN_STEP_LT_STPTOL");
    break;
  case KIN_WARNING:
    sprintf(name, "KIN_WARNING");
    break;
  case KIN_MEM_NULL:
    sprintf(name, "KIN_MEM_NULL");
    break;
  case KIN_ILL_INPUT:
    sprintf(name, "KIN_ILL_INPUT");
    break;
  case KIN_NO_MALLOC:
    sprintf(name, "KIN_NO_MALLOC");
    break;
  case KIN_MEM_FAIL:
    sprintf(name, "KIN_MEM_FAIL");
    break;
  case KIN_LINESEARCH_NONCONV:
    sprintf(name, "KIN_LINESEARCH_NONCONV");
    break;
  case KIN_MAXITER_REACHED:
    sprintf(name, "KIN_MAXITER_REACHED");
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    sprintf(name, "KIN_MXNEWT_5X_EXCEEDED");
    break;
  case KIN_LINESEARCH_BCFAIL:
    sprintf(name, "KIN_LINESEARCH_BCFAIL");
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    sprintf(name, "KIN_LINSOLV_NO_RECOVERY");
    break;
  case KIN_LINIT_FAIL:
    sprintf(name, "KIN_LINIT_FAIL");
    break;
  case KIN_LSETUP_FAIL:
    sprintf(name, "KIN_LSETUP_FAIL");
    break;
  case KIN_LSOLVE_FAIL:
    sprintf(name, "KIN_LSOLVE_FAIL");
    break;
  default:
    sprintf(name, "NONE");
  }

  return(name);
}